

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall FSingleLumpFont::LoadBMF(FSingleLumpFont *this,int lump,BYTE *data)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  CharData *pCVar7;
  BYTE *pBVar8;
  FFontChar2 *this_00;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  byte *pbVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  PalEntry sort_palette [256];
  BYTE raw_palette [768];
  uint local_76c;
  int local_740;
  byte abStack_738 [7];
  byte local_731 [1017];
  undefined1 local_338 [2];
  byte local_336;
  byte abStack_335 [773];
  
  this->FontType = BMFFONT;
  (this->super_FFont).FontHeight = (uint)data[5];
  (this->super_FFont).GlobalKerning = (int)(char)data[8];
  bVar1 = data[0x10];
  (this->super_FFont).ActiveColors = (uint)bVar1;
  (this->super_FFont).SpaceWidth = -1;
  this->RescalePalette = true;
  lVar12 = (ulong)bVar1 * 3;
  lVar12 = (ulong)data[lVar12 + 0x11] + lVar12;
  lVar5 = lVar12 + 0x14;
  uVar3 = *(ushort *)(data + lVar12 + 0x12);
  uVar18 = (uint)uVar3;
  (this->super_FFont).FirstChar = 0x100;
  (this->super_FFont).LastChar = 0;
  if (uVar3 == 0) {
    iVar17 = 0;
  }
  else {
    uVar15 = 0x100;
    iVar17 = 0;
    uVar10 = 0;
    uVar16 = 0;
    uVar6 = (uint)uVar3;
    do {
      if (((data[uVar10 + lVar12 + 0x15] != '\0') && (data[uVar10 + lVar12 + 0x16] != '\0')) ||
         (data[uVar10 + lVar12 + 0x19] != '\0')) {
        if (data[uVar10 + lVar5] < uVar15) {
          uVar15 = (uint)data[uVar10 + lVar5];
          (this->super_FFont).FirstChar = uVar15;
        }
        if (uVar16 < data[uVar10 + lVar5]) {
          uVar16 = (uint)data[uVar10 + lVar5];
          (this->super_FFont).LastChar = uVar16;
        }
        iVar17 = iVar17 + (uint)data[uVar10 + lVar12 + 0x15];
      }
      uVar10 = (ulong)((int)uVar10 +
                       (uint)data[uVar10 + lVar12 + 0x16] * (uint)data[uVar10 + lVar12 + 0x15] + 6);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    iVar17 = iVar17 * 2;
  }
  if ((this->super_FFont).LastChar < (this->super_FFont).FirstChar) {
    I_FatalError("BMF font defines no characters");
  }
  iVar9 = (this->super_FFont).LastChar - (this->super_FFont).FirstChar;
  uVar10 = 0xffffffffffffffff;
  if (-2 < iVar9) {
    uVar10 = (long)iVar9 * 0x10 + 0x10;
  }
  pCVar7 = (CharData *)operator_new__(uVar10);
  (this->super_FFont).Chars = pCVar7;
  if (-1 < iVar9) {
    lVar12 = 0;
    do {
      *(undefined8 *)((long)&pCVar7->Pic + lVar12) = 0;
      *(undefined4 *)((long)&pCVar7->XMove + lVar12) = 0x80000000;
      lVar12 = lVar12 + 0x10;
    } while ((ulong)(iVar9 + 1U) << 4 != lVar12);
  }
  uVar6 = (this->super_FFont).ActiveColors;
  if (0 < (int)uVar6) {
    uVar10 = 1;
    if (1 < (int)(uVar6 * 3)) {
      uVar10 = (ulong)(uVar6 * 3);
    }
    uVar13 = 0;
    do {
      abStack_335[uVar13] = data[uVar13 + 0x11] >> 4 | data[uVar13 + 0x11] * '\x04';
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
  }
  (this->super_FFont).ActiveColors = uVar6 + 1;
  if (-1 < (int)uVar6) {
    pbVar14 = &local_336;
    lVar12 = 0;
    do {
      abStack_738[lVar12 * 4 + 3] = (byte)lVar12;
      abStack_738[lVar12 * 4 + 2] = pbVar14[-2];
      abStack_738[lVar12 * 4 + 1] = pbVar14[-1];
      abStack_738[lVar12 * 4] = *pbVar14;
      lVar12 = lVar12 + 1;
      pbVar14 = pbVar14 + 3;
    } while ((ulong)uVar6 + 1 != lVar12);
  }
  qsort(abStack_738 + 4,(long)(int)uVar6,4,BMFCompare);
  pBVar8 = (BYTE *)operator_new__((long)(this->super_FFont).ActiveColors);
  (this->super_FFont).PatchRemap = pBVar8;
  *pBVar8 = '\0';
  if (1 < (this->super_FFont).ActiveColors) {
    lVar12 = 1;
    do {
      (this->super_FFont).PatchRemap[abStack_738[lVar12 * 4 + 3]] = (BYTE)lVar12;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->super_FFont).ActiveColors);
  }
  memcpy(this->PaletteData,local_338,0x300);
  if (uVar3 == 0) {
    local_76c = 0xffffffff;
  }
  else {
    uVar6 = 0;
    local_76c = 0xffffffff;
    do {
      bVar1 = data[(ulong)uVar6 + lVar5];
      iVar4 = (this->super_FFont).FirstChar;
      iVar11 = (uint)bVar1 - iVar4;
      if (iVar11 < 0) {
        __assert_fail("chardata[chari] - FirstChar >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                      ,0x507,"void FSingleLumpFont::LoadBMF(int, const BYTE *)");
      }
      if (iVar9 < iVar11) {
        __assert_fail("chardata[chari] - FirstChar < count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                      ,0x508,"void FSingleLumpFont::LoadBMF(int, const BYTE *)");
      }
      pbVar14 = data + (ulong)uVar6 + lVar5;
      if (bVar1 == 0x4e) {
        local_76c = (uint)pbVar14[5];
      }
      else if (bVar1 == 0x20) {
        (this->super_FFont).SpaceWidth = (uint)pbVar14[5];
      }
      (this->super_FFont).Chars[(ulong)*pbVar14 - (long)iVar4].XMove = (uint)pbVar14[5];
      bVar1 = pbVar14[1];
      if ((bVar1 != 0) && (bVar2 = pbVar14[2], bVar2 != 0)) {
        this_00 = (FFontChar2 *)operator_new(0x78);
        local_740 = (int)data;
        FFontChar2::FFontChar2
                  (this_00,lump,((int)pbVar14 - local_740) + 6,(uint)bVar1,(uint)bVar2,
                   -(int)(char)pbVar14[3],-(int)(char)pbVar14[4]);
        (this->super_FFont).Chars[(ulong)*pbVar14 - (long)(this->super_FFont).FirstChar].Pic =
             (FTexture *)this_00;
      }
      uVar6 = uVar6 + (uint)pbVar14[2] * (uint)pbVar14[1] + 6;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  if ((this->super_FFont).SpaceWidth < 0) {
    if ((int)local_76c < 0) {
      local_76c = iVar17 / (int)((iVar9 + 1U) * 3);
    }
    (this->super_FFont).SpaceWidth = local_76c;
  }
  FFont::FixXMoves(&this->super_FFont);
  (*(this->super_FFont)._vptr_FFont[4])(this);
  return;
}

Assistant:

void FSingleLumpFont::LoadBMF(int lump, const BYTE *data)
{
	const BYTE *chardata;
	int numchars, count, totalwidth, nwidth;
	int infolen;
	int i, chari;
	BYTE raw_palette[256*3];
	PalEntry sort_palette[256];

	FontType = BMFFONT;
	FontHeight = data[5];
	GlobalKerning = (SBYTE)data[8];
	ActiveColors = data[16];
	SpaceWidth = -1;
	nwidth = -1;
	RescalePalette = true;

	infolen = data[17 + ActiveColors*3];
	chardata = data + 18 + ActiveColors*3 + infolen;
	numchars = chardata[0] + 256*chardata[1];
	chardata += 2;

	// Scan for lowest and highest characters defined and total font width.
	FirstChar = 256;
	LastChar = 0;
	totalwidth = 0;
	for (i = chari = 0; i < numchars; ++i, chari += 6 + chardata[chari+1] * chardata[chari+2])
	{
		if ((chardata[chari+1] == 0 || chardata[chari+2] == 0) && chardata[chari+5] == 0)
		{ // Don't count empty characters.
			continue;
		}
		if (chardata[chari] < FirstChar)
		{
			FirstChar = chardata[chari];
		}
		if (chardata[chari] > LastChar)
		{
			LastChar = chardata[chari];
		}
		totalwidth += chardata[chari+1];
	}
	if (LastChar < FirstChar)
	{
		I_FatalError("BMF font defines no characters");
	}
	count = LastChar - FirstChar + 1;
	Chars = new CharData[count];
	for (i = 0; i < count; ++i)
	{
		Chars[i].Pic = NULL;
		Chars[i].XMove = INT_MIN;
	}

	// BMF palettes are only six bits per component. Fix that.
	for (i = 0; i < ActiveColors*3; ++i)
	{
		raw_palette[i+3] = (data[17 + i] << 2) | (data[17 + i] >> 4);
	}
	ActiveColors++;

	// Sort the palette by increasing brightness
	for (i = 0; i < ActiveColors; ++i)
	{
		PalEntry *pal = &sort_palette[i];
		pal->a = i;		// Use alpha part to point back to original entry
		pal->r = raw_palette[i*3 + 0];
		pal->g = raw_palette[i*3 + 1];
		pal->b = raw_palette[i*3 + 2];
	}
	qsort(sort_palette + 1, ActiveColors - 1, sizeof(PalEntry), BMFCompare);

	// Create the PatchRemap table from the sorted "alpha" values.
	PatchRemap = new BYTE[ActiveColors];
	PatchRemap[0] = 0;
	for (i = 1; i < ActiveColors; ++i)
	{
		PatchRemap[sort_palette[i].a] = i;
	}

	memcpy(PaletteData, raw_palette, 768);

	// Now scan through the characters again, creating glyphs for each one.
	for (i = chari = 0; i < numchars; ++i, chari += 6 + chardata[chari+1] * chardata[chari+2])
	{
		assert(chardata[chari] - FirstChar >= 0);
		assert(chardata[chari] - FirstChar < count);
		if (chardata[chari] == ' ')
		{
			SpaceWidth = chardata[chari+5];
		}
		else if (chardata[chari] == 'N')
		{
			nwidth = chardata[chari+5];
		}
		Chars[chardata[chari] - FirstChar].XMove = chardata[chari+5];
		if (chardata[chari+1] == 0 || chardata[chari+2] == 0)
		{ // Empty character: skip it.
			continue;
		}
		Chars[chardata[chari] - FirstChar].Pic = new FFontChar2(lump, int(chardata + chari + 6 - data),
			chardata[chari+1],	// width
			chardata[chari+2],	// height
			-(SBYTE)chardata[chari+3],	// x offset
			-(SBYTE)chardata[chari+4]	// y offset
		);
	}

	// If the font did not define a space character, determine a suitable space width now.
	if (SpaceWidth < 0)
	{
		if (nwidth >= 0)
		{
			SpaceWidth = nwidth;
		}
		else
		{
			SpaceWidth = totalwidth * 2 / (3 * count);
		}
	}

	FixXMoves();
	LoadTranslations();
}